

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optionmenuitems.h
# Opt level: O3

bool __thiscall
FOptionMenuScreenResolutionLine::GetString
          (FOptionMenuScreenResolutionLine *this,int i,char *s,int len)

{
  uint uVar1;
  
  uVar1 = i - 0x30000;
  if (uVar1 < 3) {
    strncpy(s,this->mResTexts[uVar1].Chars,(long)len - 1);
    s[(long)len + -1] = '\0';
  }
  return uVar1 < 3;
}

Assistant:

bool GetString(int i, char *s, int len)
	{
		if (i >= SRL_INDEX && i <= SRL_INDEX+2) 
		{
			strncpy(s, mResTexts[i-SRL_INDEX], len-1);
			s[len-1] = 0;
			return true;
		}
		return false;
	}